

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:598:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:598:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  uint32_t uVar1;
  value *v;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  pointer pvVar5;
  ulong __n;
  long lVar6;
  ulong uVar7;
  vector<mjs::value,_std::allocator<mjs::value>_> values;
  anon_class_48_2_bfc5d542 sort_compare;
  value comparefn;
  undefined1 local_128 [40];
  value *local_100;
  value *local_f8;
  gc_heap *local_f0;
  wstring_view local_e8;
  wstring local_d8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_b8;
  gc_heap_ptr_untyped *local_a0;
  value local_98;
  gc_heap *local_70;
  value local_68;
  
  local_100 = __return_storage_ptr__;
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ == object) {
    local_f8 = this_;
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(this_->field_1).s_);
    local_f0 = (gc_heap *)puVar2[1];
    local_68.type_ = reference;
    local_68._4_4_ = 0;
    local_68.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)0x1960b8;
    (**(code **)*puVar2)(&local_98,puVar2);
    uVar1 = to_uint32(&local_98);
    value::destroy(&local_98);
    pvVar5 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar5 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      pvVar5 = (pointer)&value::undefined;
    }
    local_a0 = (gc_heap_ptr_untyped *)&this_->field_1;
    value::value(&local_68,pvVar5);
    value::value(&local_98,&local_68);
    local_70 = local_f0;
    __n = (ulong)uVar1;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              (&local_b8,__n,(allocator_type *)local_128);
    if (uVar1 != 0) {
      lVar6 = 0;
      uVar7 = 0;
      uVar4 = extraout_RDX;
      do {
        index_string_abi_cxx11_(&local_d8,(mjs *)(uVar7 & 0xffffffff),(uint32_t)uVar4);
        local_e8._M_len = local_d8._M_string_length;
        local_e8._M_str = local_d8._M_dataplus._M_p;
        (**(code **)*puVar2)((value *)local_128,puVar2,&local_e8);
        value::operator=((value *)((long)&(local_b8.
                                           super__Vector_base<mjs::value,_std::allocator<mjs::value>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->type_ + lVar6
                                  ),(value *)local_128);
        value::destroy((value *)local_128);
        uVar4 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 4 + 4);
          uVar4 = extraout_RDX_01;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x28;
      } while (__n != uVar7);
    }
    pvVar5 = local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar6 = ((long)local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
                           *)local_128,
                          (__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                           )local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
      if ((value *)local_128._16_8_ == (value *)0x0) {
        std::operator()((__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                         )pvVar5,(__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                                  )local_b8.
                                   super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                        (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:632:56)>
                         )&local_98);
      }
      else {
        std::operator()((__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                         )pvVar5,(__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                                  )local_b8.
                                   super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                        (value *)local_128._16_8_,local_128._8_8_,
                        (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:632:56)>
                         )&local_98);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
                  *)local_128);
    }
    if (local_f8->type_ == object) {
      plVar3 = (long *)gc_heap_ptr_untyped::get(local_a0);
      if (uVar1 != 0) {
        lVar6 = 0;
        uVar7 = 0;
        uVar4 = extraout_RDX_02;
        do {
          index_string_abi_cxx11_((wstring *)local_128,(mjs *)(uVar7 & 0xffffffff),(uint32_t)uVar4);
          local_e8._M_len = local_128._8_8_;
          local_e8._M_str = (wchar_t *)local_128._0_8_;
          string::string((string *)&local_d8,local_f0,&local_e8);
          (**(code **)(*plVar3 + 8))
                    (plVar3,&local_d8,
                     (long)&(local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                             _M_impl.super__Vector_impl_data._M_start)->type_ + lVar6,0);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d8);
          uVar4 = extraout_RDX_03;
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ * 4 + 4);
            uVar4 = extraout_RDX_04;
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x28;
        } while (__n != uVar7);
      }
      value::value(local_100,local_f8);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_b8);
      value::destroy(&local_98);
      value::destroy(&local_68);
      return local_100;
    }
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }